

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QCompleterPrivate::showPopup(QCompleterPrivate *this,QRect *rect)

{
  uint uVar1;
  uint uVar2;
  QWidget *pQVar3;
  QWidgetData *pQVar4;
  long lVar5;
  int aw;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  QAbstractItemModel *pQVar9;
  QScrollBar *pQVar10;
  int extraout_var;
  QPoint QVar11;
  int iVar12;
  int iVar13;
  Representation RVar14;
  QWidget *this_00;
  Representation RVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  int local_5c;
  QPoint local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::screen((QWidget *)(this->widget).wp.value);
  auVar16 = QScreen::availableGeometry();
  LVar6 = QWidget::layoutDirection((QWidget *)(this->widget).wp.value);
  iVar7 = (**(code **)(*(long *)&(this->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget
                      + 0x1f8))(this->popup,0);
  pQVar9 = QAbstractItemView::model((QAbstractItemView *)this->popup);
  local_50.xp.m_i = -1;
  local_50.yp.m_i = -1;
  local_48 = 0;
  uStack_40 = 0;
  iVar8 = (**(code **)(*(long *)pQVar9 + 0x78))(pQVar9);
  if (this->maxVisibleItems < iVar8) {
    iVar8 = this->maxVisibleItems;
  }
  iVar8 = iVar8 * iVar7 + 6;
  pQVar10 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->popup);
  if ((pQVar10 != (QScrollBar *)0x0) &&
     ((((pQVar10->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
    pQVar10 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->popup);
    (**(code **)(*(long *)&(pQVar10->super_QAbstractSlider).super_QWidget + 0x70))();
    iVar8 = iVar8 + extraout_var;
  }
  RVar14.m_i = (rect->x1).m_i;
  local_5c = (rect->y1).m_i;
  iVar7 = (rect->x2).m_i;
  RVar15.m_i = (rect->y2).m_i;
  if (RVar15.m_i < local_5c || iVar7 < RVar14.m_i) {
    pQVar3 = (QWidget *)(this->widget).wp.value;
    pQVar4 = pQVar3->data;
    uVar1 = (pQVar4->crect).y1.m_i;
    uVar2 = (pQVar4->crect).y2.m_i;
    local_5c = ~uVar2 + uVar1;
    this_00 = (QWidget *)0x0;
    if (*(int *)((this->widget).wp.d + 4) != 0) {
      this_00 = pQVar3;
    }
    local_50 = (QPoint)((ulong)(~uVar1 + uVar2) << 0x20);
    QVar11 = QWidget::mapToGlobal(this_00,&local_50);
    lVar5 = *(long *)((this->widget).wp.value + 0x20);
    iVar7 = *(int *)(lVar5 + 0x1c) - *(int *)(lVar5 + 0x14);
  }
  else {
    iVar7 = iVar7 - RVar14.m_i;
    if (LVar6 == RightToLeft) {
      local_50.xp.m_i = (rect->x2).m_i;
      local_50.yp.m_i = (rect->y2).m_i;
    }
    else {
      local_50.yp.m_i = RVar15.m_i;
      local_50.xp.m_i = RVar14.m_i;
    }
    local_5c = local_5c + ~RVar15.m_i;
    QVar11 = QWidget::mapToGlobal((QWidget *)(this->widget).wp.value,&local_50);
  }
  RVar14 = QVar11.yp.m_i;
  iVar12 = auVar16._8_4_ + 1;
  iVar13 = auVar16._0_4_;
  aw = iVar12 - iVar13;
  if (iVar7 + 1 < iVar12 - iVar13) {
    aw = iVar7 + 1;
  }
  RVar15.m_i = iVar12 - aw;
  if (QVar11.xp.m_i.m_i + aw <= iVar12) {
    RVar15.m_i = QVar11.xp.m_i.m_i;
  }
  if (RVar15.m_i <= iVar13) {
    RVar15.m_i = iVar13;
  }
  iVar12 = auVar16._12_4_ - RVar14.m_i;
  iVar7 = QWidget::minimumHeight((QWidget *)this->popup);
  if (iVar7 < iVar8) {
    iVar7 = iVar8;
  }
  if (iVar12 < iVar7) {
    iVar13 = (local_5c - auVar16._4_4_) + RVar14.m_i + 2;
    iVar8 = iVar12;
    if (iVar12 < iVar13) {
      iVar8 = iVar13;
    }
    if (iVar7 <= iVar8) {
      iVar8 = iVar7;
    }
    iVar7 = iVar8;
    if (iVar12 < iVar13) {
      RVar14.m_i = ((local_5c + RVar14.m_i) - iVar8) + 2;
    }
  }
  QWidget::setGeometry((QWidget *)this->popup,RVar15.m_i,RVar14.m_i,aw,iVar7);
  if ((((QWidget *)this->popup)->data->widget_attributes & 0x8000) == 0) {
    QWidget::show((QWidget *)this->popup);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleterPrivate::showPopup(const QRect& rect)
{
    const QRect screen = widget->screen()->availableGeometry();
    Qt::LayoutDirection dir = widget->layoutDirection();
    QPoint pos;
    int rh, w;
    int h = (popup->sizeHintForRow(0) * qMin(maxVisibleItems, popup->model()->rowCount()) + 3) + 3;
    QScrollBar *hsb = popup->horizontalScrollBar();
    if (hsb && hsb->isVisible())
        h += popup->horizontalScrollBar()->sizeHint().height();

    if (rect.isValid()) {
        rh = rect.height();
        w = rect.width();
        pos = widget->mapToGlobal(dir == Qt::RightToLeft ? rect.bottomRight() : rect.bottomLeft());
    } else {
        rh = widget->height();
        pos = widget->mapToGlobal(QPoint(0, widget->height() - 2));
        w = widget->width();
    }

    if (w > screen.width())
        w = screen.width();
    if ((pos.x() + w) > (screen.x() + screen.width()))
        pos.setX(screen.x() + screen.width() - w);
    if (pos.x() < screen.x())
        pos.setX(screen.x());

    int top = pos.y() - rh - screen.top() + 2;
    int bottom = screen.bottom() - pos.y();
    h = qMax(h, popup->minimumHeight());
    if (h > bottom) {
        h = qMin(qMax(top, bottom), h);

        if (top > bottom)
            pos.setY(pos.y() - h - rh + 2);
    }

    popup->setGeometry(pos.x(), pos.y(), w, h);

    if (!popup->isVisible())
        popup->show();
}